

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O0

Iterator * __thiscall
wasm::
SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
::SCC::Iterator::operator++(Iterator *this)

{
  Iterator *this_local;
  
  stepToNextElem(this->parent);
  setVal(this);
  return this;
}

Assistant:

Iterator& operator++() {
        parent->stepToNextElem();
        setVal();
        return *this;
      }